

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cc
# Opt level: O0

unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
bssl::VerifyTrustStore::FromDER(string_view der_certs,string *out_diagnostic)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer this;
  shared_ptr<const_bssl::ParsedCertificate> *psVar4;
  string *in_RCX;
  char *extraout_RDX;
  __uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
  this_00;
  string *in_R8;
  Span<const_unsigned_char> SVar5;
  string_view s;
  Span<const_unsigned_char> cert_00;
  unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_> local_118;
  shared_ptr<const_bssl::ParsedCertificate> local_110;
  Span<const_unsigned_char> local_100;
  undefined1 local_f0 [8];
  optional<std::shared_ptr<const_bssl::ParsedCertificate>_> parsed_cert;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  CBS cert;
  size_t cert_num;
  undefined1 local_40 [8];
  CBS cbs;
  __single_object store;
  string *out_diagnostic_local;
  string_view der_certs_local;
  
  this_00.
  super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>._M_t.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>)
       der_certs._M_len;
  ::std::make_unique<bssl::TrustStoreInMemory>();
  s._M_str = extraout_RDX;
  s._M_len = (size_t)out_diagnostic;
  SVar5 = StringAsBytes((bssl *)der_certs._M_str,s);
  cbs_st::cbs_st((cbs_st *)local_40,SVar5);
  cert.len = 1;
  do {
    sVar3 = CBS_len((CBS *)local_40);
    if (sVar3 == 0) {
      ::std::unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>::
      unique_ptr(&local_118,
                 (unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>
                  *)&cbs.len);
      WrapTrustStore((bssl *)this_00.
                             super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
                             .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl,
                     &local_118);
      ::std::unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>::
      ~unique_ptr(&local_118);
      parsed_cert.super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>._20_4_ = 1;
LAB_0060f314:
      ::std::unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>::
      ~unique_ptr((unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>
                   *)&cbs.len);
      return (__uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
              )(tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
               this_00.
               super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
               .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
    }
    iVar2 = CBS_get_asn1_element((CBS *)local_40,(CBS *)local_90,0x20000010);
    if (iVar2 == 0) {
      ::std::__cxx11::to_string(&local_d0,cert.len);
      ::std::operator+(&local_b0,"failed to get ASN.1 SEQUENCE from input at cert ",&local_d0);
      ::std::__cxx11::string::operator=(in_RCX,(string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::unique_ptr<bssl::VerifyTrustStore,std::default_delete<bssl::VerifyTrustStore>>::
      unique_ptr<std::default_delete<bssl::VerifyTrustStore>,void>
                ((unique_ptr<bssl::VerifyTrustStore,std::default_delete<bssl::VerifyTrustStore>> *)
                 this_00.
                 super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
                 .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl);
      parsed_cert.super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>._20_4_ = 1;
      goto LAB_0060f314;
    }
    SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_90);
    cert_00.data_ = (uchar *)SVar5.size_;
    cert_00.size_ = (size_t)in_RCX;
    local_100 = SVar5;
    anon_unknown_19::InternalParseCertificate
              ((optional<std::shared_ptr<const_bssl::ParsedCertificate>_> *)local_f0,
               (anon_unknown_19 *)SVar5.data_,cert_00,in_R8);
    bVar1 = ::std::optional<std::shared_ptr<const_bssl::ParsedCertificate>_>::has_value
                      ((optional<std::shared_ptr<const_bssl::ParsedCertificate>_> *)local_f0);
    if (bVar1) {
      this = ::std::
             unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>::
             operator->((unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>
                         *)&cbs.len);
      psVar4 = ::std::optional<std::shared_ptr<const_bssl::ParsedCertificate>_>::value
                         ((optional<std::shared_ptr<const_bssl::ParsedCertificate>_> *)local_f0);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr(&local_110,psVar4);
      TrustStoreInMemory::AddTrustAnchor(this,&local_110);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_110);
    }
    else {
      ::std::unique_ptr<bssl::VerifyTrustStore,std::default_delete<bssl::VerifyTrustStore>>::
      unique_ptr<std::default_delete<bssl::VerifyTrustStore>,void>
                ((unique_ptr<bssl::VerifyTrustStore,std::default_delete<bssl::VerifyTrustStore>> *)
                 this_00.
                 super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
                 .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl);
    }
    parsed_cert.super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>._21_3_ = 0;
    parsed_cert.super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>._20_1_ = !bVar1;
    ::std::optional<std::shared_ptr<const_bssl::ParsedCertificate>_>::~optional
              ((optional<std::shared_ptr<const_bssl::ParsedCertificate>_> *)local_f0);
    if (parsed_cert.
        super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>.
        _M_payload.
        super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>._20_4_ != 0)
    goto LAB_0060f314;
    cert.len = cert.len + 1;
  } while( true );
}

Assistant:

std::unique_ptr<VerifyTrustStore> VerifyTrustStore::FromDER(
    std::string_view der_certs, std::string *out_diagnostic) {
  auto store = std::make_unique<TrustStoreInMemory>();
  CBS cbs = StringAsBytes(der_certs);

  for (size_t cert_num = 1; CBS_len(&cbs) != 0; cert_num++) {
    CBS cert;
    if (!CBS_get_asn1_element(&cbs, &cert, CBS_ASN1_SEQUENCE)) {
      *out_diagnostic = "failed to get ASN.1 SEQUENCE from input at cert " +
                        std::to_string(cert_num);
      return {};
    }

    auto parsed_cert = InternalParseCertificate(cert, out_diagnostic);
    if (!parsed_cert.has_value()) {
      return {};
    }
    store->AddTrustAnchor(parsed_cert.value());
  }

  return WrapTrustStore(std::move(store));
}